

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time.cpp
# Opt level: O2

tm * pstore::gm_time(tm *__return_storage_ptr__,time_t clock)

{
  int *piVar1;
  tm *ptVar2;
  time_t clock_local;
  
  clock_local = clock;
  piVar1 = __errno_location();
  *piVar1 = 0;
  __return_storage_ptr__->tm_sec = 0;
  __return_storage_ptr__->tm_min = 0;
  __return_storage_ptr__->tm_hour = 0;
  __return_storage_ptr__->tm_mday = 0;
  __return_storage_ptr__->tm_mon = 0;
  __return_storage_ptr__->tm_year = 0;
  __return_storage_ptr__->tm_wday = 0;
  __return_storage_ptr__->tm_yday = 0;
  *(undefined8 *)&__return_storage_ptr__->tm_isdst = 0;
  __return_storage_ptr__->tm_gmtoff = 0;
  __return_storage_ptr__->tm_zone = (char *)0x0;
  ptVar2 = gmtime_r(&clock_local,(tm *)__return_storage_ptr__);
  if (ptVar2 == (tm *)0x0) {
    raise<pstore::errno_erc,char[9]>((errno_erc)*piVar1,(char (*) [9])"gmtime_r");
  }
  if (ptVar2 == (tm *)__return_storage_ptr__) {
    return __return_storage_ptr__;
  }
  assert_failed("res == &result",
                "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/lib/os/time.cpp"
                ,0x41);
}

Assistant:

struct std::tm gm_time (std::time_t const clock) {
        errno = 0;
        struct tm result {};
        struct tm * const res = gmtime_r (&clock, &result);
        if (res == nullptr) {
            raise (errno_erc{errno}, "gmtime_r");
        }
        PSTORE_ASSERT (res == &result);
        return result;
    }